

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Query.hpp
# Opt level: O1

void __thiscall database::Query::Query(Query *this,char *query_string)

{
  _Rb_tree_header *p_Var1;
  allocator<char> local_41 [17];
  
  std::__cxx11::string::string<std::allocator<char>>((string *)this,query_string,local_41);
  (this->m_database_name)._M_dataplus._M_p = (pointer)&(this->m_database_name).field_2;
  (this->m_database_name)._M_string_length = 0;
  (this->m_database_name).field_2._M_local_buf[0] = '\0';
  (this->m_container_name)._M_dataplus._M_p = (pointer)&(this->m_container_name).field_2;
  (this->m_container_name)._M_string_length = 0;
  (this->m_container_name).field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->m_container_schema)._M_t._M_impl.super__Rb_tree_header;
  (this->m_container_schema)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_container_schema)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  (this->m_container_schema)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_container_schema)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_container_schema)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_values)._M_t._M_impl.super__Rb_tree_header;
  (this->m_values)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_values)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_values)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_values)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  p_Var1 = &(this->m_filter)._M_t._M_impl.super__Rb_tree_header;
  (this->m_filter)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_filter)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_values)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m_dataset).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_dataset).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_dataset).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_filter)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_filter)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_filter)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  database::Query::_ParseQueryString();
  return;
}

Assistant:

Query(const char* query_string)
    :m_query_string((std::string)query_string) { _ParseQueryString(); }